

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::get_cost_to_go_losses
               (search *sch,v_array<std::pair<unsigned_int,_float>_> *gold_action_losses,
               uint32_t left_label,uint32_t right_label)

{
  v_array<unsigned_int> valid_actions_00;
  v_array<unsigned_int> valid_actions_01;
  v_array<unsigned_int> valid_actions_02;
  v_array<unsigned_int> valid_actions_03;
  v_array<unsigned_int> valid_actions_04;
  bool bVar1;
  task_data *ptVar2;
  uint32_t *puVar3;
  v_array<unsigned_int> *this;
  v_array<unsigned_int> *pvVar4;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  search *in_RDI;
  action i_1;
  uint32_t j;
  uint32_t i;
  uint32_t *num_label;
  v_array<unsigned_int> *valid_actions;
  v_array<unsigned_int> *action_loss;
  uint32_t *sys;
  bool *one_learner;
  task_data *data;
  pair<unsigned_int,_float> *ppVar5;
  v_array<std::pair<unsigned_int,_float>_> *in_stack_fffffffffffffe60;
  v_array<std::pair<unsigned_int,_float>_> *pvVar6;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  uint local_e4;
  uint local_9c;
  uint local_78;
  
  ptVar2 = Search::search::get_task_data<task_data>(in_RDI);
  puVar3 = &ptVar2->transition_system;
  this = &ptVar2->action_loss;
  pvVar4 = &ptVar2->valid_actions;
  v_array<std::pair<unsigned_int,_float>_>::clear(in_stack_fffffffffffffe60);
  if ((ptVar2->one_learner & 1U) == 0) {
    for (local_e4 = 1; local_e4 < 4; local_e4 = local_e4 + 1) {
      ppVar5 = (pair<unsigned_int,_float> *)pvVar4->_begin;
      pvVar6 = (v_array<std::pair<unsigned_int,_float>_> *)(ptVar2->valid_actions)._end;
      valid_actions_03._end = (uint *)in_stack_fffffffffffffe88;
      valid_actions_03._begin = (uint *)in_stack_fffffffffffffe80;
      valid_actions_03.end_array._0_4_ = in_stack_fffffffffffffe90;
      valid_actions_03.end_array._4_4_ = in_stack_fffffffffffffe94;
      valid_actions_03.erase_count._0_4_ = in_stack_fffffffffffffe98;
      valid_actions_03.erase_count._4_4_ = in_stack_fffffffffffffe9c;
      bVar1 = is_valid((uint64_t)(ptVar2->valid_actions).end_array,valid_actions_03);
      if (bVar1) {
        in_stack_fffffffffffffe80 = in_RSI;
        v_array<unsigned_int>::operator[](this,(ulong)local_e4);
        std::make_pair<unsigned_int&,float>(&ppVar5->first,(float *)0x3d8fec);
        v_array<std::pair<unsigned_int,_float>_>::push_back(pvVar6,ppVar5);
      }
    }
    if (*puVar3 == 2) {
      ppVar5 = (pair<unsigned_int,_float> *)pvVar4->_begin;
      pvVar6 = (v_array<std::pair<unsigned_int,_float>_> *)(ptVar2->valid_actions)._end;
      valid_actions_04._end = (uint *)in_stack_fffffffffffffe88;
      valid_actions_04._begin = (uint *)in_stack_fffffffffffffe80;
      valid_actions_04.end_array._0_4_ = in_stack_fffffffffffffe90;
      valid_actions_04.end_array._4_4_ = in_stack_fffffffffffffe94;
      valid_actions_04.erase_count._0_4_ = in_stack_fffffffffffffe98;
      valid_actions_04.erase_count._4_4_ = in_stack_fffffffffffffe9c;
      bVar1 = is_valid((uint64_t)(ptVar2->valid_actions).end_array,valid_actions_04);
      if (bVar1) {
        v_array<unsigned_int>::operator[](this,4);
        std::make_pair<unsigned_int_const&,float>(&ppVar5->first,(float *)0x3d90d4);
        v_array<std::pair<unsigned_int,_float>_>::push_back(pvVar6,ppVar5);
      }
    }
  }
  else {
    ppVar5 = (pair<unsigned_int,_float> *)pvVar4->_begin;
    pvVar6 = (v_array<std::pair<unsigned_int,_float>_> *)(ptVar2->valid_actions)._end;
    valid_actions_00._end = (uint *)in_stack_fffffffffffffe88;
    valid_actions_00._begin = (uint *)in_stack_fffffffffffffe80;
    valid_actions_00.end_array._0_4_ = in_stack_fffffffffffffe90;
    valid_actions_00.end_array._4_4_ = in_stack_fffffffffffffe94;
    valid_actions_00.erase_count._0_4_ = in_stack_fffffffffffffe98;
    valid_actions_00.erase_count._4_4_ = in_stack_fffffffffffffe9c;
    bVar1 = is_valid((uint64_t)(ptVar2->valid_actions).end_array,valid_actions_00);
    if (bVar1) {
      v_array<unsigned_int>::operator[](this,1);
      std::make_pair<unsigned_int_const&,float>(&ppVar5->first,(float *)0x3d8bf4);
      v_array<std::pair<unsigned_int,_float>_>::push_back(pvVar6,ppVar5);
    }
    for (local_78 = 2; local_78 < 4; local_78 = local_78 + 1) {
      ppVar5 = (pair<unsigned_int,_float> *)pvVar4->_begin;
      pvVar6 = (v_array<std::pair<unsigned_int,_float>_> *)(ptVar2->valid_actions)._end;
      valid_actions_01._end = (uint *)in_stack_fffffffffffffe88;
      valid_actions_01._begin = (uint *)in_stack_fffffffffffffe80;
      valid_actions_01.end_array._0_4_ = in_stack_fffffffffffffe90;
      valid_actions_01.end_array._4_4_ = in_stack_fffffffffffffe94;
      valid_actions_01.erase_count._0_4_ = in_stack_fffffffffffffe98;
      valid_actions_01.erase_count._4_4_ = in_stack_fffffffffffffe9c;
      bVar1 = is_valid((uint64_t)(ptVar2->valid_actions).end_array,valid_actions_01);
      if (bVar1) {
        for (local_9c = 1; local_9c <= ptVar2->num_label; local_9c = local_9c + 1) {
          if ((*puVar3 == 2) || ((ulong)local_9c != ptVar2->root_label)) {
            v_array<unsigned_int>::operator[](this,(ulong)local_78);
            in_stack_fffffffffffffe9c = in_ECX;
            if (local_78 == 3) {
              in_stack_fffffffffffffe9c = in_EDX;
            }
            in_stack_fffffffffffffe94 = 0;
            in_stack_fffffffffffffe98 = 0x3f800000;
            if (local_9c == in_stack_fffffffffffffe9c) {
              in_stack_fffffffffffffe98 = 0;
            }
            std::make_pair<unsigned_int,float>(&ppVar5->first,(float *)0x3d8dce);
            v_array<std::pair<unsigned_int,_float>_>::push_back(pvVar6,ppVar5);
          }
        }
      }
    }
    if (*puVar3 == 2) {
      ppVar5 = (pair<unsigned_int,_float> *)pvVar4->_begin;
      pvVar6 = (v_array<std::pair<unsigned_int,_float>_> *)(ptVar2->valid_actions)._end;
      valid_actions_02._end = (uint *)in_stack_fffffffffffffe88;
      valid_actions_02._begin = (uint *)in_stack_fffffffffffffe80;
      valid_actions_02.end_array._0_4_ = in_stack_fffffffffffffe90;
      valid_actions_02.end_array._4_4_ = in_stack_fffffffffffffe94;
      valid_actions_02.erase_count._0_4_ = in_stack_fffffffffffffe98;
      valid_actions_02.erase_count._4_4_ = in_stack_fffffffffffffe9c;
      bVar1 = is_valid((uint64_t)(ptVar2->valid_actions).end_array,valid_actions_02);
      if (bVar1) {
        v_array<unsigned_int>::operator[](this,4);
        std::make_pair<unsigned_int,float>(&ppVar5->first,(float *)0x3d8ef7);
        v_array<std::pair<unsigned_int,_float>_>::push_back(pvVar6,ppVar5);
      }
    }
  }
  return;
}

Assistant:

void get_cost_to_go_losses(
    Search::search &sch, v_array<pair<action, float>> &gold_action_losses, uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  bool &one_learner = data->one_learner;
  uint32_t &sys = data->transition_system;
  v_array<uint32_t> &action_loss = data->action_loss, &valid_actions = data->valid_actions;
  uint32_t &num_label = data->num_label;
  gold_action_losses.clear();

  if (one_learner)
  {
    if (is_valid(SHIFT, valid_actions))
      gold_action_losses.push_back(make_pair(SHIFT, (float)action_loss[SHIFT]));
    for (uint32_t i = 2; i <= 3; i++)
      if (is_valid(i, valid_actions))
      {
        for (uint32_t j = 1; j <= num_label; j++)
          if (sys == arc_eager || j != data->root_label)
            gold_action_losses.push_back(make_pair((1 + j + (i - 2) * num_label),
                action_loss[i] + (float)(j != (i == REDUCE_LEFT ? left_label : right_label))));
      }
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(2 + num_label * 2, (float)action_loss[REDUCE]));
  }
  else
  {
    for (action i = 1; i <= 3; i++)
      if (is_valid(i, valid_actions))
        gold_action_losses.push_back(make_pair(i, (float)action_loss[i]));
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(REDUCE, (float)action_loss[REDUCE]));
  }
}